

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_type.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::issue_async_shutdown_visitor::operator()
          (issue_async_shutdown_visitor *this,ssl_stream<libtorrent::aux::utp_stream> *s)

{
  shared_ptr<void> local_70;
  socket_closer local_60;
  io_context *local_38;
  undefined4 local_2c;
  undefined **local_28;
  io_context **local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  local_38 = *(io_context **)
              ((long)&((s->m_sock)._M_t.
                       super___uniq_ptr_impl<boost::asio::ssl::stream<libtorrent::aux::utp_stream>,_std::default_delete<boost::asio::ssl::stream<libtorrent::aux::utp_stream>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_boost::asio::ssl::stream<libtorrent::aux::utp_stream>_*,_std::default_delete<boost::asio::ssl::stream<libtorrent::aux::utp_stream>_>_>
                       .
                       super__Head_base<0UL,_boost::asio::ssl::stream<libtorrent::aux::utp_stream>_*,_false>
                      ._M_head_impl)->next_layer_ + 0x80);
  local_20 = &local_38;
  local_18 = boost::asio::execution::detail::any_executor_base::
             target_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
             ::fns_with_execute;
  local_28 = &boost::asio::execution::detail::any_executor_base::
              object_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
              ::fns;
  local_2c = 0;
  local_10 = boost::asio::execution::
             any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
             ::
             prop_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>()
             ::fns;
  local_70.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->holder_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->holder_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->holder_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->holder_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  socket_closer::socket_closer(&local_60,local_38,&local_70,this->sock_type_);
  ssl_stream<libtorrent::aux::utp_stream>::async_shutdown<libtorrent::aux::socket_closer>
            (s,&local_60);
  if (local_60.t.
      super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.t.
               super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_60.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.h.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_70.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (*(code *)*local_28)();
  return;
}

Assistant:

void operator()(ssl_stream<T>& s)
		{
			// we do this twice, because the socket_closer callback will be
			// called twice
			ADD_OUTSTANDING_ASYNC("on_close_socket");
			ADD_OUTSTANDING_ASYNC("on_close_socket");
			s.async_shutdown(socket_closer(static_cast<io_context&>(s.get_executor().context())
				, std::move(holder_), sock_type_));
		}